

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPointCloudShape.cpp
# Opt level: O3

void __thiscall
cbtConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (cbtConvexPointCloudShape *this,cbtVector3 *vectors,cbtVector3 *supportVerticesOut,
          int numVectors)

{
  undefined8 uVar1;
  cbtVector3 *pcVar2;
  ulong uVar3;
  cbtScalar *pcVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  
  if (0 < numVectors) {
    uVar3 = 0;
    do {
      if ((long)this->m_numPoints < 1) {
        supportVerticesOut[uVar3].m_floats[3] = -1e+18;
      }
      else {
        pcVar2 = this->m_unscaledPoints;
        uVar5 = 0xffffffff;
        uVar6 = 0;
        auVar7 = SUB6416(ZEXT464(0xff7fffff),0);
        pcVar4 = pcVar2->m_floats + 2;
        do {
          auVar9 = vfmadd231ss_fma(ZEXT416((uint)(vectors[uVar3].m_floats[1] *
                                                  *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x20 *
                                                 pcVar4[-1])),
                                   ZEXT416((uint)(vectors[uVar3].m_floats[0] *
                                                 *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.super_cbtConvexShape.
                                                  super_cbtCollisionShape.field_0x1c)),
                                   ZEXT416((uint)((cbtVector3 *)(pcVar4 + -2))->m_floats[0]));
          auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)(vectors[uVar3].m_floats[2] *
                                                        *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x24)),
                                   ZEXT416((uint)*pcVar4));
          fVar8 = auVar7._0_4_;
          auVar7 = vmaxss_avx(auVar9,auVar7);
          if (fVar8 < auVar9._0_4_) {
            uVar5 = uVar6 & 0xffffffff;
          }
          uVar6 = uVar6 + 1;
          pcVar4 = pcVar4 + 4;
        } while ((long)this->m_numPoints != uVar6);
        supportVerticesOut[uVar3].m_floats[3] = -1e+18;
        if (-1 < (int)uVar5) {
          uVar1 = *(undefined8 *)
                   &(this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape
                    .super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
                    field_0x1c;
          auVar9._0_4_ = (float)*(undefined8 *)pcVar2[uVar5].m_floats * (float)uVar1;
          auVar9._4_4_ = (float)((ulong)*(undefined8 *)pcVar2[uVar5].m_floats >> 0x20) *
                         (float)((ulong)uVar1 >> 0x20);
          auVar9._8_8_ = 0;
          auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(pcVar2[uVar5].m_floats[2] *
                                                      *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x24)),0x28);
          *(undefined1 (*) [16])supportVerticesOut[uVar3].m_floats = auVar9;
          supportVerticesOut[uVar3].m_floats[3] = auVar7._0_4_;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)numVectors);
  }
  return;
}

Assistant:

void cbtConvexPointCloudShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const cbtVector3* vectors, cbtVector3* supportVerticesOut, int numVectors) const
{
	for (int j = 0; j < numVectors; j++)
	{
		const cbtVector3& vec = vectors[j] * m_localScaling;  // dot( a*c, b) = dot(a, b*c)
		cbtScalar maxDot;
		int index = (int)vec.maxDot(&m_unscaledPoints[0], m_numPoints, maxDot);
		supportVerticesOut[j][3] = cbtScalar(-BT_LARGE_FLOAT);
		if (0 <= index)
		{
			//WARNING: don't swap next lines, the w component would get overwritten!
			supportVerticesOut[j] = getScaledPoint(index);
			supportVerticesOut[j][3] = maxDot;
		}
	}
}